

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<float,int,float,duckdb::BinaryStandardOperatorWrapper,duckdb::RoundOperatorPrecision,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool bVar1;
  float *pfVar2;
  int *piVar3;
  float *pfVar4;
  undefined1 in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  float fVar5;
  bool in_stack_0000000f;
  float *result_data;
  int *rdata;
  float *ldata;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar6;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar7;
  
  Vector::SetVectorType(in_RSI,(VectorType)((ulong)in_RDX >> 0x38));
  pfVar2 = ConstantVector::GetData<float>((Vector *)0x20b1904);
  piVar3 = ConstantVector::GetData<int>((Vector *)0x20b1913);
  pfVar4 = ConstantVector::GetData<float>((Vector *)0x20b1922);
  bVar1 = ConstantVector::IsNull((Vector *)0x20b1931);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x20b193f), !bVar1)) {
    uVar7 = CONCAT13(in_CL,(int3)in_stack_ffffffffffffffc4) & 0x1ffffff;
    fVar5 = *pfVar2;
    iVar6 = *piVar3;
    ConstantVector::Validity(in_RDX);
    fVar5 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::RoundOperatorPrecision,float,int,float>
                      (SUB81((ulong)piVar3 >> 0x38,0),SUB84(piVar3,0),(int)((ulong)pfVar4 >> 0x20),
                       (ValidityMask *)CONCAT44(uVar7,iVar6),
                       CONCAT44(fVar5,in_stack_ffffffffffffffb8));
    *pfVar4 = fVar5;
    return;
  }
  ConstantVector::SetNull((Vector *)result_data,in_stack_0000000f);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}